

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

type_info * pybind11::detail::get_type_info(PyTypeObject *type)

{
  bool bVar1;
  internals *piVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> local_38;
  unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *local_30;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> local_28;
  const_iterator it;
  unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *type_dict;
  PyTypeObject *type_local;
  
  piVar2 = get_internals();
  it.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)
       &piVar2->registered_types_py;
  type_dict = (unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
               *)type;
  do {
    local_30 = type_dict;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
         ::find(it.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur,
                &local_30);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
         ::end(it.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur);
    bVar1 = std::__detail::operator!=(&local_28,&local_38);
    if (bVar1) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::operator->
                         ((_Node_const_iterator<std::pair<const_void_*const,_void_*>,_false,_false>
                           *)&local_28);
      return (type_info *)pvVar3->second;
    }
    type_dict = *(unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                  **)&type_dict[4]._M_h._M_rehash_policy;
  } while (type_dict !=
           (unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
            *)0x0);
  return (type_info *)0x0;
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info* get_type_info(PyTypeObject *type) {
    auto const &type_dict = get_internals().registered_types_py;
    do {
        auto it = type_dict.find(type);
        if (it != type_dict.end())
            return (detail::type_info *) it->second;
        type = type->tp_base;
        if (!type)
            return nullptr;
    } while (true);
}